

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  float fVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  Tuple2<pbrt::Point2,_float> TVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Float FVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar42 [56];
  undefined1 auVar41 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  float fVar74;
  array<float,_3> aVar75;
  optional<pbrt::ShapeSample> ss;
  Float triPDF;
  undefined1 local_198 [16];
  undefined1 local_178 [16];
  Tuple2<pbrt::Point2,_float> local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [88];
  bool local_60;
  undefined1 local_58 [16];
  float local_44;
  Tuple3<pbrt::Point3,_float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar37._8_56_ = in_register_00001208;
  auVar37._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_130 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar37._0_16_);
  lVar15 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar18 = *(long *)(lVar15 + 8);
  lVar13 = (long)this->triIndex;
  lVar14 = (long)*(int *)(lVar18 + lVar13 * 0xc);
  lVar4 = *(long *)(lVar15 + 0x10);
  fVar31 = *(float *)(lVar4 + 8 + lVar14 * 0xc);
  lVar16 = (long)*(int *)(lVar18 + 4 + lVar13 * 0xc);
  local_d8 = ZEXT416(*(uint *)(lVar4 + 8 + lVar16 * 0xc));
  lVar17 = (long)*(int *)(lVar18 + 8 + lVar13 * 0xc);
  local_198._8_8_ = 0;
  local_198._0_8_ = *(ulong *)(lVar4 + lVar14 * 0xc);
  local_178._0_8_ = *(ulong *)(lVar4 + lVar16 * 0xc);
  local_178._8_8_ = 0;
  uVar1 = *(undefined8 *)(lVar4 + lVar17 * 0xc);
  local_108 = (float)uVar1;
  fStack_104 = (float)((ulong)uVar1 >> 0x20);
  uStack_100 = 0;
  local_118 = ZEXT416(*(uint *)(lVar4 + 8 + lVar17 * 0xc));
  auVar19._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar19._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar19._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar19._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  uVar1 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar20._0_4_ = (float)uVar1 + auVar19._0_4_;
  auVar20._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar19._4_4_;
  auVar20._8_4_ = auVar19._8_4_ + 0.0;
  auVar20._12_4_ = auVar19._12_4_ + 0.0;
  auVar27._8_4_ = 0x3f000000;
  auVar27._0_8_ = 0x3f0000003f000000;
  auVar27._12_4_ = 0x3f000000;
  auVar19 = vmulps_avx512vl(auVar20,auVar27);
  local_b8._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_b8._0_8_ = vmovlps_avx(auVar19);
  FVar28 = SolidAngle(this,(Point3f *)local_b8);
  if ((FVar28 < 0.0002) || (6.22 < FVar28)) {
    Sample((optional<pbrt::ShapeSample> *)local_b8,this,(Point2f *)&local_130);
    if (local_60 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
    }
    local_b8._24_4_ = ctx->time;
    auVar22._4_4_ = local_b8._12_4_;
    auVar22._0_4_ = local_b8._8_4_;
    auVar22._8_4_ = local_b8._16_4_;
    auVar22._12_4_ = local_b8._20_4_;
    fVar31 = ((float)local_b8._0_4_ + (float)local_b8._4_4_) * 0.5 -
             ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
             (ctx->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
    auVar21._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar21._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar21._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar21._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
    auVar19 = vinsertps_avx(auVar22,ZEXT416((uint)local_b8._20_4_),0x10);
    auVar25._0_4_ = ((float)local_b8._12_4_ + auVar19._0_4_) * 0.5;
    auVar25._4_4_ = ((float)local_b8._16_4_ + auVar19._4_4_) * 0.5;
    auVar25._8_4_ = (auVar19._8_4_ + 0.0) * 0.5;
    auVar25._12_4_ = (auVar19._12_4_ + 0.0) * 0.5;
    uVar1 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar19 = vinsertps_avx(auVar21,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high),0x10);
    auVar23._0_4_ = ((float)uVar1 + auVar19._0_4_) * 0.5;
    auVar23._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar19._4_4_) * 0.5;
    auVar23._8_4_ = (auVar19._8_4_ + 0.0) * 0.5;
    auVar23._12_4_ = (auVar19._12_4_ + 0.0) * 0.5;
    auVar27 = vsubps_avx(auVar25,auVar23);
    auVar19 = vmovshdup_avx(auVar27);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),ZEXT416((uint)fVar31),
                              ZEXT416((uint)fVar31));
    auVar19 = vfmadd231ss_fma(auVar20,auVar19,auVar19);
    fVar29 = auVar19._0_4_;
    if ((fVar29 != 0.0) || (NAN(fVar29))) {
      if (fVar29 < 0.0) {
        local_118 = auVar27;
        local_108 = fVar31;
        fVar29 = sqrtf(fVar29);
        fVar31 = local_108;
        auVar27 = local_118;
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar29 = auVar19._0_4_;
      }
      if (local_60 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      auVar57._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar57._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar57._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar24._4_4_ = fVar29;
      auVar24._0_4_ = fVar29;
      auVar24._8_4_ = fVar29;
      auVar24._12_4_ = fVar29;
      auVar19 = vdivps_avx(auVar57,auVar24);
      auVar58._4_4_ = local_b8._48_4_;
      auVar58._0_4_ = local_b8._44_4_;
      auVar58._8_8_ = 0;
      auVar64._0_4_ = auVar19._0_4_ * (float)local_b8._44_4_;
      auVar64._4_4_ = auVar19._4_4_ * (float)local_b8._48_4_;
      auVar64._8_4_ = auVar19._8_4_ * 0.0;
      auVar64._12_4_ = auVar19._12_4_ * 0.0;
      uVar10 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
      auVar53._0_8_ = uVar10 ^ 0x8000000080000000;
      auVar53._8_4_ = -auVar64._8_4_;
      auVar53._12_4_ = -auVar64._12_4_;
      auVar27 = vpermi2ps_avx512vl(_DAT_005ca5c0,auVar64,auVar53);
      auVar19 = vfmadd231ps_fma(auVar27,auVar58,auVar19);
      auVar19 = vhaddps_avx(auVar19,auVar19);
      auVar19 = vfnmadd231ss_fma(auVar19,ZEXT416((uint)(fVar31 / fVar29)),
                                 ZEXT416((uint)local_b8._40_4_));
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl(auVar19,auVar26);
      fVar31 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5 -
               ((float)local_b8._8_4_ + (float)local_b8._12_4_) * 0.5;
      auVar19 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5 -
                              ((float)local_b8._0_4_ + (float)local_b8._4_4_) * 0.5));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar19,auVar19);
      auVar20 = ZEXT416((uint)(((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
                              ((float)local_b8._16_4_ + (float)local_b8._20_4_) * 0.5));
      auVar19 = vfmadd231ss_fma(auVar19,auVar20,auVar20);
      fVar31 = (float)local_b8._80_4_ / (auVar27._0_4_ / auVar19._0_4_);
      if (ABS(fVar31) != INFINITY) {
        __return_storage_ptr__->set = local_60;
        *(undefined8 *)&__return_storage_ptr__->optionalValue = local_b8._0_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_b8._12_4_,local_b8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_b8._20_4_,local_b8._16_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_b8._24_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
             CONCAT44(local_b8._36_4_,local_b8._32_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_b8._44_4_,local_b8._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_b8._52_4_,local_b8._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_b8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_b8._64_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_b8._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar31;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         (fVar29 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar29 != 0.0)) || (NAN(fVar29)))
       || ((fVar29 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar29 != 0.0 || (NAN(fVar29)))
          )) {
      fVar47 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
      fVar29 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5;
      fVar74 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar11._4_4_ = fStack_104;
      auVar11._0_4_ = local_108;
      auVar11._8_8_ = uStack_100;
      fVar30 = local_108 - fVar47;
      auVar19 = vmovshdup_avx(auVar11);
      fVar72 = auVar19._0_4_ - fVar29;
      fVar5 = (float)local_118._0_4_ - fVar74;
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar72 * fVar72)),ZEXT416((uint)fVar30),
                                ZEXT416((uint)fVar30));
      auVar19 = vinsertps_avx(local_198,local_178,0x4c);
      auVar48._4_4_ = fVar29;
      auVar48._0_4_ = fVar29;
      auVar48._8_4_ = fVar29;
      auVar48._12_4_ = fVar29;
      auVar20 = vsubps_avx(auVar19,auVar48);
      fVar29 = auVar20._0_4_;
      auVar49._0_4_ = fVar29 * fVar29;
      auVar49._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar49._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar49._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar27 = vmovshdup_avx(auVar49);
      auVar19 = vinsertps_avx(local_178,local_198,0x1c);
      auVar32._4_4_ = fVar47;
      auVar32._0_4_ = fVar47;
      auVar32._8_4_ = fVar47;
      auVar32._12_4_ = fVar47;
      local_128 = vsubps_avx(auVar19,auVar32);
      auVar19 = vmovshdup_avx(local_128);
      auVar27 = vfmadd213ss_fma(auVar19,auVar19,auVar27);
      auVar19 = vinsertps_avx(local_d8,ZEXT416((uint)fVar31),0x10);
      auVar50._4_4_ = fVar74;
      auVar50._0_4_ = fVar74;
      auVar50._8_4_ = fVar74;
      auVar50._12_4_ = fVar74;
      local_c8 = vsubps_avx(auVar19,auVar50);
      auVar19 = vmovshdup_avx(local_c8);
      auVar19 = vfmadd213ss_fma(auVar19,auVar19,auVar27);
      local_e8._0_4_ = fVar30;
      local_f8._0_4_ = fVar72;
      if (auVar19._0_4_ < 0.0) {
        auVar38._0_4_ = sqrtf(auVar19._0_4_);
        auVar38._4_60_ = extraout_var;
        auVar21 = ZEXT416(auVar21._0_4_);
        auVar19 = auVar38._0_16_;
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
      }
      auVar27 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),local_128,local_128);
      auVar21 = vfmadd231ss_fma(auVar21,local_c8,local_c8);
      if (auVar21._0_4_ < 0.0) {
        local_58 = auVar19;
        auVar39._0_4_ = sqrtf(auVar21._0_4_);
        auVar39._4_60_ = extraout_var_00;
        auVar21 = auVar39._0_16_;
        auVar27 = ZEXT416(auVar27._0_4_);
        auVar19 = local_58;
      }
      else {
        auVar21 = vsqrtss_avx(auVar21,auVar21);
      }
      auVar21 = vinsertps_avx(auVar21,auVar19,0x10);
      auVar19 = vdivps_avx(local_128,auVar21);
      auVar20 = vdivps_avx(auVar20,auVar21);
      auVar21 = vdivps_avx(local_c8,auVar21);
      if (auVar27._0_4_ < 0.0) {
        local_128 = auVar21;
        fVar29 = sqrtf(auVar27._0_4_);
        auVar21 = local_128;
      }
      else {
        auVar27 = vsqrtss_avx(auVar27,auVar27);
        fVar29 = auVar27._0_4_;
      }
      TVar12 = local_130;
      auVar43._0_4_ = (float)local_e8._0_4_ / fVar29;
      auVar43._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar51._0_4_ = (float)local_f8._0_4_ / fVar29;
      auVar51._4_12_ = SUB6012((undefined1  [60])0x0,0);
      fVar47 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar54._4_4_ = fVar47;
      auVar54._0_4_ = fVar47;
      auVar54._8_4_ = fVar47;
      auVar54._12_4_ = fVar47;
      auVar60._0_4_ = auVar21._0_4_ * fVar47;
      auVar60._4_4_ = auVar21._4_4_ * fVar47;
      auVar60._8_4_ = auVar21._8_4_ * fVar47;
      auVar60._12_4_ = auVar21._12_4_ * fVar47;
      fVar74 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      auVar65._4_4_ = fVar74;
      auVar65._0_4_ = fVar74;
      auVar65._8_4_ = fVar74;
      auVar65._12_4_ = fVar74;
      auVar27 = vfmadd213ps_fma(auVar20,auVar65,auVar60);
      auVar20 = vfmsub213ps_fma(auVar21,auVar54,auVar60);
      auVar61._0_4_ = auVar20._0_4_ + auVar27._0_4_;
      auVar61._4_4_ = auVar20._4_4_ + auVar27._4_4_;
      auVar61._8_4_ = auVar20._8_4_ + auVar27._8_4_;
      auVar61._12_4_ = auVar20._12_4_ + auVar27._12_4_;
      fVar74 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      auVar69._4_4_ = fVar74;
      auVar69._0_4_ = fVar74;
      auVar69._8_4_ = fVar74;
      auVar69._12_4_ = fVar74;
      auVar19 = vfmadd213ps_fma(auVar19,auVar69,auVar61);
      auVar62._8_4_ = 0x7fffffff;
      auVar62._0_8_ = 0x7fffffff7fffffff;
      auVar62._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx(auVar19,auVar62);
      auVar9._8_4_ = 0x3c23d70a;
      auVar9._0_8_ = 0x3c23d70a3c23d70a;
      auVar9._12_4_ = 0x3c23d70a;
      auVar20 = vmaxps_avx512vl(auVar19,auVar9);
      auVar27 = ZEXT416((uint)((fVar5 / fVar29) * fVar47));
      auVar19 = vfmadd213ss_fma(auVar51,auVar65,auVar27);
      auVar27 = vfmsub213ss_fma(ZEXT416((uint)(fVar5 / fVar29)),auVar54,auVar27);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar27._0_4_)),auVar69,auVar43);
      auVar19 = vandps_avx(auVar19,auVar62);
      local_e8 = vmaxss_avx(auVar19,ZEXT416(0x3c23d70a));
      auVar66._8_8_ = 0;
      auVar66._0_4_ = local_130.x;
      auVar66._4_4_ = local_130.y;
      auVar27 = vmovshdup_avx(auVar66);
      auVar19 = vinsertps_avx(auVar20,local_e8,0x10);
      local_f8._0_4_ = auVar20._0_4_ + auVar19._0_4_;
      local_f8._4_4_ = auVar20._4_4_ + auVar19._4_4_;
      local_f8._8_4_ = auVar20._8_4_ + auVar19._8_4_;
      local_f8._12_4_ = auVar20._12_4_ + auVar19._12_4_;
      auVar19 = vmovshdup_avx(local_f8);
      fVar74 = auVar19._0_4_;
      fVar29 = (float)local_f8._0_4_ + fVar74;
      fVar47 = auVar27._0_4_;
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar47 * fVar74 * fVar74)),
                                ZEXT416((uint)((float)local_f8._0_4_ * (float)local_f8._0_4_)),
                                ZEXT416((uint)(1.0 - fVar47)));
      if (auVar19._0_4_ < 0.0) {
        fVar74 = sqrtf(auVar19._0_4_);
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
        fVar74 = auVar19._0_4_;
      }
      auVar21 = vminss_avx512f(ZEXT416(0x3f7fffff),
                               ZEXT416((uint)((fVar47 * fVar29) / (local_f8._0_4_ + fVar74))));
      auVar22 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar21);
      auVar19 = vmovshdup_avx(auVar20);
      auVar27 = vmulss_avx512f(auVar19,auVar21);
      auVar23 = vfmadd231ss_avx512f(auVar27,auVar22,auVar20);
      fVar29 = auVar21._0_4_;
      auVar27 = vfmadd231ss_avx512f(ZEXT416((uint)(local_e8._0_4_ * fVar29)),auVar22,auVar20);
      auVar25 = vaddss_avx512f(auVar23,auVar27);
      auVar25 = vmulss_avx512f(auVar66,auVar25);
      auVar26 = vmulss_avx512f(auVar23,auVar23);
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(TVar12.x * auVar27._0_4_ * auVar27._0_4_)),auVar26,
                                ZEXT416((uint)(1.0 - TVar12.x)));
      if (auVar27._0_4_ < 0.0) {
        local_128._0_4_ = auVar22._0_4_;
        local_c8._0_4_ = auVar23._0_4_;
        local_58._0_4_ = auVar25._0_4_;
        auVar40._0_4_ = sqrtf(auVar27._0_4_);
        auVar40._4_60_ = extraout_var_01;
        auVar27 = auVar40._0_16_;
        auVar25 = ZEXT416((uint)local_58._0_4_);
        auVar23 = ZEXT416((uint)local_c8._0_4_);
        auVar22 = ZEXT416((uint)local_128._0_4_);
      }
      else {
        auVar27 = vsqrtss_avx(auVar27,auVar27);
      }
      auVar67._4_4_ = fStack_104;
      auVar67._0_4_ = local_108;
      auVar67._8_8_ = uStack_100;
      auVar27 = vaddss_avx512f(auVar27,auVar23);
      auVar27 = vdivss_avx512f(auVar25,auVar27);
      auVar23 = vminss_avx512f(ZEXT416(0x3f7fffff),auVar27);
      auVar27 = vinsertps_avx(auVar23,auVar21,0x10);
      local_130 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar27);
      fVar47 = 0.0;
      fVar74 = auVar23._0_4_;
      if (((0.0 <= fVar74) && (fVar74 <= 1.0)) && ((0.0 <= fVar29 && (fVar29 <= 1.0)))) {
        fVar30 = local_e8._0_4_ + auVar19._0_4_ + local_f8._0_4_;
        if ((fVar30 != 0.0) || (fVar47 = 1.0, NAN(fVar30))) {
          auVar27 = vmulss_avx512f(auVar22,ZEXT416((uint)(1.0 - fVar74)));
          auVar21 = vmulss_avx512f(auVar22,auVar23);
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar21._0_4_)),auVar20,auVar27);
          auVar19 = vfmadd213ss_fma(auVar19,ZEXT416((uint)(fVar29 * (1.0 - fVar74))),auVar27);
          auVar19 = vfmadd213ss_fma(local_e8,ZEXT416((uint)(fVar29 * fVar74)),auVar19);
          fVar47 = (auVar19._0_4_ * 4.0) / fVar30;
        }
      }
    }
    else {
      auVar67._4_4_ = fStack_104;
      auVar67._0_4_ = local_108;
      auVar67._8_8_ = uStack_100;
      fVar47 = 1.0;
    }
    local_b8._0_8_ = vmovlps_avx(local_198);
    uVar1 = vmovlps_avx(local_178);
    local_b8._12_4_ = (undefined4)uVar1;
    local_b8._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_b8._24_8_ = vmovlps_avx(auVar67);
    auVar3._0_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar3._4_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar3._8_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar3._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    uVar1 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar19 = vinsertps_avx(auVar3,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high),0x10);
    auVar33._0_4_ = (float)uVar1 + auVar19._0_4_;
    auVar33._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar19._4_4_;
    auVar33._8_4_ = auVar19._8_4_ + 0.0;
    auVar33._12_4_ = auVar19._12_4_ + 0.0;
    auVar7._8_4_ = 0x3f000000;
    auVar7._0_8_ = 0x3f0000003f000000;
    auVar7._12_4_ = 0x3f000000;
    auVar19 = vmulps_avx512vl(auVar33,auVar7);
    local_40.z = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                 (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    local_40._0_8_ = vmovlps_avx(auVar19);
    auVar42 = ZEXT856(auVar19._8_8_);
    local_b8._8_4_ = fVar31;
    local_b8._20_4_ = local_d8._0_4_;
    local_b8._32_4_ = local_118._0_4_;
    aVar75 = SampleSphericalTriangle
                       ((array<pbrt::Point3<float>,_3> *)local_b8,(Point3f *)&local_40,
                        (Point2f *)&local_130,&local_44);
    fVar74 = aVar75.values[2];
    auVar41._0_8_ = aVar75.values._0_8_;
    auVar41._8_56_ = auVar42;
    fVar29 = aVar75.values[0];
    if ((local_44 != 0.0) || (NAN(local_44))) {
      auVar20 = vmovshdup_avx(auVar41._0_16_);
      auVar24 = vbroadcastss_avx512vl(auVar41._0_16_);
      auVar25 = vmulps_avx512vl(local_198,auVar24);
      fVar72 = auVar20._0_4_;
      auVar73._0_4_ = fVar72 * (float)local_178._0_8_;
      auVar73._4_4_ = auVar20._4_4_ * (float)((ulong)local_178._0_8_ >> 0x20);
      auVar73._8_4_ = auVar20._8_4_ * 0.0;
      auVar73._12_4_ = auVar20._12_4_ * 0.0;
      auVar26 = vmulss_avx512f(local_d8,auVar20);
      local_b8._8_4_ = local_118._0_4_ * fVar74 + fVar31 * fVar29 + auVar26._0_4_;
      auVar71._4_4_ = fStack_104;
      auVar71._0_4_ = local_108;
      auVar71._8_8_ = uStack_100;
      auVar44._0_4_ = local_108 * fVar74 + auVar25._0_4_ + auVar73._0_4_;
      auVar44._4_4_ = fStack_104 * fVar74 + auVar25._4_4_ + auVar73._4_4_;
      auVar44._8_4_ = (float)uStack_100 * fVar74 + auVar25._8_4_ + auVar73._8_4_;
      auVar44._12_4_ = (float)((ulong)uStack_100 >> 0x20) * fVar74 + auVar25._12_4_ + auVar73._12_4_
      ;
      local_b8._0_8_ = vmovlps_avx(auVar44);
      auVar19 = vinsertps_avx512f(local_d8,local_118,0x10);
      auVar45._4_4_ = fVar31;
      auVar45._0_4_ = fVar31;
      auVar45._8_4_ = fVar31;
      auVar45._12_4_ = fVar31;
      auVar27 = vsubps_avx(auVar19,auVar45);
      auVar19 = vblendps_avx(auVar71,local_178,2);
      auVar21 = vsubps_avx(auVar19,local_198);
      auVar19 = vblendps_avx(local_178,auVar71,2);
      auVar22 = vsubps_avx(auVar19,local_198);
      auVar19 = vshufps_avx(auVar27,auVar27,0xe1);
      auVar63._0_4_ = auVar22._0_4_ * auVar19._0_4_;
      auVar63._4_4_ = auVar22._4_4_ * auVar19._4_4_;
      auVar63._8_4_ = auVar22._8_4_ * auVar19._8_4_;
      auVar63._12_4_ = auVar22._12_4_ * auVar19._12_4_;
      auVar23 = vfmsub213ps_fma(auVar21,auVar27,auVar63);
      auVar19 = vinsertps_avx(auVar22,auVar27,0x1c);
      auVar27 = vinsertps_avx(auVar22,auVar27,0x4c);
      auVar19 = vfnmadd213ps_fma(auVar27,auVar19,auVar63);
      auVar70._0_4_ = auVar23._0_4_ + auVar19._0_4_;
      auVar70._4_4_ = auVar23._4_4_ + auVar19._4_4_;
      auVar70._8_4_ = auVar23._8_4_ + auVar19._8_4_;
      auVar70._12_4_ = auVar23._12_4_ + auVar19._12_4_;
      auVar27 = vmovshdup_avx(auVar21);
      auVar19 = vmovshdup_avx(auVar22);
      auVar23 = ZEXT416((uint)(auVar27._0_4_ * auVar21._0_4_));
      auVar22 = vfmsub213ss_fma(auVar19,auVar22,auVar23);
      auVar55._0_4_ = auVar70._0_4_ * auVar70._0_4_;
      auVar55._4_4_ = auVar70._4_4_ * auVar70._4_4_;
      auVar55._8_4_ = auVar70._8_4_ * auVar70._8_4_;
      auVar55._12_4_ = auVar70._12_4_ * auVar70._12_4_;
      auVar19 = vhaddps_avx(auVar55,auVar55);
      auVar27 = vfnmadd213ss_fma(auVar21,auVar27,auVar23);
      fVar74 = auVar22._0_4_ + auVar27._0_4_;
      fVar30 = fVar74 * fVar74 + auVar19._0_4_;
      if (fVar30 < 0.0) {
        local_c8._0_4_ = fVar74;
        local_128 = auVar70;
        local_f8 = auVar25;
        local_e8 = auVar73;
        local_d8 = auVar26;
        fVar30 = sqrtf(fVar30);
        auVar71._4_4_ = fStack_104;
        auVar71._0_4_ = local_108;
        auVar71._8_8_ = uStack_100;
        fVar74 = (float)local_c8._0_4_;
        auVar70 = local_128;
        auVar25 = local_f8;
        auVar73 = local_e8;
        auVar26 = local_d8;
      }
      else {
        auVar19 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
        fVar30 = auVar19._0_4_;
      }
      auVar46._4_4_ = fVar30;
      auVar46._0_4_ = fVar30;
      auVar46._8_4_ = fVar30;
      auVar46._12_4_ = fVar30;
      auVar19 = vdivps_avx(auVar70,auVar46);
      fVar74 = fVar74 / fVar30;
      local_198 = vshufps_avx512vl(auVar19,auVar19,0xe1);
      lVar4 = *(long *)(lVar15 + 0x18);
      if (lVar4 == 0) {
        if (*(char *)(lVar15 + 0x38) != *(char *)(lVar15 + 0x39)) {
          auVar19 = vshufps_avx(auVar19,auVar19,0xe1);
          local_198._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
          local_198._8_4_ = auVar19._8_4_ ^ 0x80000000;
          local_198._12_4_ = auVar19._12_4_ ^ 0x80000000;
          fVar74 = -fVar74;
        }
      }
      else {
        lVar15 = (long)*(int *)(lVar18 + lVar13 * 0xc);
        lVar14 = (long)*(int *)(lVar18 + 4 + lVar13 * 0xc);
        fVar5 = (1.0 - fVar29) - fVar72;
        lVar18 = (long)*(int *)(lVar18 + 8 + lVar13 * 0xc);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar4 + 4 + lVar15 * 0xc);
        auVar27 = vmulps_avx512vl(auVar24,auVar34);
        uVar1 = *(undefined8 *)(lVar4 + 4 + lVar14 * 0xc);
        uVar2 = *(undefined8 *)(lVar4 + 4 + lVar18 * 0xc);
        auVar52._0_4_ = auVar27._0_4_ + fVar72 * (float)uVar1 + fVar5 * (float)uVar2;
        auVar52._4_4_ =
             auVar27._4_4_ + auVar20._4_4_ * (float)((ulong)uVar1 >> 0x20) +
             fVar5 * (float)((ulong)uVar2 >> 0x20);
        auVar52._8_4_ = auVar27._8_4_ + auVar20._8_4_ * 0.0 + fVar5 * 0.0;
        auVar52._12_4_ = auVar27._12_4_ + auVar20._12_4_ * 0.0 + fVar5 * 0.0;
        auVar27 = vmovshdup_avx(auVar52);
        fVar30 = fVar74 * auVar27._0_4_;
        auVar68._0_4_ = -fVar30;
        auVar68._4_4_ = 0x80000000;
        auVar68._8_4_ = 0x80000000;
        auVar68._12_4_ = 0x80000000;
        auVar27 = vinsertps_avx(auVar19,ZEXT416((uint)fVar74),0x10);
        auVar20 = vinsertps_avx(ZEXT416((uint)fVar30),auVar68,0x10);
        auVar27 = vfmadd231ps_fma(auVar20,auVar52,auVar27);
        auVar27 = vhaddps_avx(auVar27,auVar27);
        auVar20 = vmovshdup_avx(auVar19);
        auVar27 = vfmadd213ss_fma(auVar20,ZEXT416((uint)(fVar29 * *(float *)(lVar4 + lVar15 * 0xc) +
                                                         fVar72 * *(float *)(lVar4 + lVar14 * 0xc) +
                                                        fVar5 * *(float *)(lVar4 + lVar18 * 0xc))),
                                  auVar27);
        auVar56._0_12_ = ZEXT812(0);
        auVar56._12_4_ = 0;
        if (auVar27._0_4_ < 0.0) {
          auVar19 = vshufps_avx(auVar19,auVar19,0xe1);
          local_198._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
          local_198._8_4_ = auVar19._8_4_ ^ 0x80000000;
          local_198._12_4_ = auVar19._12_4_ ^ 0x80000000;
        }
        uVar1 = vcmpss_avx512f(auVar27,auVar56,1);
        bVar6 = (bool)((byte)uVar1 & 1);
        fVar74 = (float)((uint)bVar6 * (int)-fVar74 + (uint)!bVar6 * (int)fVar74);
      }
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx(auVar25,auVar35);
      auVar27 = vandps_avx(ZEXT416((uint)(fVar31 * fVar29)),auVar35);
      auVar20 = vandps_avx(auVar73,auVar35);
      auVar21 = vandps_avx(auVar26,auVar35);
      fVar72 = (1.0 - fVar29) - fVar72;
      auVar22 = vandps_avx(ZEXT416((uint)(local_118._0_4_ * fVar72)),auVar35);
      local_40.z = (auVar27._0_4_ + auVar21._0_4_ + auVar22._0_4_) * 3.57628e-07;
      auVar59._0_4_ = auVar71._0_4_ * fVar72;
      auVar59._4_4_ = auVar71._4_4_ * fVar72;
      auVar59._8_4_ = auVar71._8_4_ * fVar72;
      auVar59._12_4_ = auVar71._12_4_ * fVar72;
      auVar27 = vandps_avx(auVar59,auVar35);
      auVar36._0_4_ = auVar19._0_4_ + auVar20._0_4_ + auVar27._0_4_;
      auVar36._4_4_ = auVar19._4_4_ + auVar20._4_4_ + auVar27._4_4_;
      auVar36._8_4_ = auVar19._8_4_ + auVar20._8_4_ + auVar27._8_4_;
      auVar36._12_4_ = auVar19._12_4_ + auVar20._12_4_ + auVar27._12_4_;
      auVar8._8_4_ = 0x34c00005;
      auVar8._0_8_ = 0x34c0000534c00005;
      auVar8._12_4_ = 0x34c00005;
      auVar19 = vmulps_avx512vl(auVar36,auVar8);
      local_40._0_8_ = vmovlps_avx(auVar19);
      Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)local_b8,
                         (Vector3f *)&local_40);
      FVar28 = ctx->time;
      __return_storage_ptr__->set = true;
      *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar28;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
      uVar1 = vmovlps_avx(local_198);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar1;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar74;
      *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) =
           ZEXT816(0) << 0x20;
      *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) =
           ZEXT816(0) << 0x20;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_44 * fVar47;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
      *(undefined8 *)&__return_storage_ptr__->set = 0;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf *= BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }